

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void y_string_suite::y_string_two_byte_utf_8(void)

{
  char input [11];
  reader reader;
  undefined4 local_18c;
  return_type local_188;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"[\"\\u0123\"]",0xb);
  local_188._M_dataplus._M_p = (pointer)strlen(local_168);
  local_188._M_string_length = (size_type)local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_188);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xec8,"void y_string_suite::y_string_two_byte_utf_8()",&local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xeca,"void y_string_suite::y_string_two_byte_utf_8()",&local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::value(&local_188,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("reader.value<std::string>()","\"\\xC4\\xA3\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xecb,"void y_string_suite::y_string_two_byte_utf_8()",&local_188,anon_var_dwarf_5576)
  ;
  std::__cxx11::string::~string((string *)&local_188);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xecd,"void y_string_suite::y_string_two_byte_utf_8()",&local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_18c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xecf,"void y_string_suite::y_string_two_byte_utf_8()",&local_188,&local_18c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void y_string_two_byte_utf_8()
{
    const char input[] = "[\"\\u0123\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xC4\xA3");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}